

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

bool __thiscall QTreeModel::clearItemData(QTreeModel *this,QModelIndex *index)

{
  bool bVar1;
  ulong uVar2;
  QTreeWidgetItem *pQVar3;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *itm;
  const_iterator endIter;
  const_iterator beginIter;
  undefined4 in_stack_ffffffffffffff18;
  CheckIndexOption in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  QVariantList *this_00;
  bool local_69;
  undefined1 local_68 [24];
  QWidgetItemData *local_50;
  QWidgetItemData *local_48;
  QWidgetItemData *local_40;
  QWidgetItemData *local_38;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<QAbstractItemModel::CheckIndexOption>::QFlags
            ((QFlags<QAbstractItemModel::CheckIndexOption> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c
            );
  uVar2 = QAbstractItemModel::checkIndex(in_RDI,(QFlags_conflict1 *)in_RSI);
  if ((uVar2 & 1) == 0) {
    local_69 = false;
  }
  else {
    pQVar3 = item((QTreeModel *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                  (QModelIndex *)0x90f06f);
    if (pQVar3 == (QTreeWidgetItem *)0x0) {
      local_69 = false;
    }
    else {
      local_38 = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::column(in_RSI);
      QList<QList<QWidgetItemData>_>::at
                ((QList<QList<QWidgetItemData>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_38 = (QWidgetItemData *)
                 QList<QWidgetItemData>::cbegin
                           ((QList<QWidgetItemData> *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      local_40 = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::column(in_RSI);
      QList<QList<QWidgetItemData>_>::at
                ((QList<QList<QWidgetItemData>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_50 = (QWidgetItemData *)
                 QList<QWidgetItemData>::cend
                           ((QList<QWidgetItemData> *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      local_48 = local_38;
      local_40 = local_50;
      bVar1 = std::
              all_of<QList<QWidgetItemData>::const_iterator,QTreeModel::clearItemData(QModelIndex_const&)::__0>
                        (local_38,local_50);
      if (bVar1) {
        QModelIndex::column(in_RSI);
        QList<QVariant>::at((QList<QVariant> *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        bVar1 = ::QVariant::isValid((QVariant *)
                                    CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        if (!bVar1) {
          local_69 = true;
          goto LAB_0090f26b;
        }
      }
      ::QVariant::QVariant((QVariant *)0x90f195);
      this_00 = &pQVar3->d->display;
      QModelIndex::column(in_RSI);
      QList<QVariant>::operator[]
                ((QList<QVariant> *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      ::QVariant::operator=
                ((QVariant *)this_00,
                 (QVariant *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      ::QVariant::~QVariant(&local_28);
      QModelIndex::column(in_RSI);
      QList<QList<QWidgetItemData>_>::operator[]
                ((QList<QList<QWidgetItemData>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QList<QWidgetItemData>::clear
                ((QList<QWidgetItemData> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      memset(local_68,0,0x18);
      QList<int>::QList((QList<int> *)0x90f23d);
      QAbstractItemModel::dataChanged(in_RDI,(QModelIndex *)in_RSI,(QList_conflict2 *)in_RSI);
      QList<int>::~QList((QList<int> *)0x90f266);
      local_69 = true;
    }
  }
LAB_0090f26b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_69;
}

Assistant:

bool QTreeModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QTreeWidgetItem *itm = item(index);
    if (!itm)
        return false;
    const auto beginIter = itm->values.at(index.column()).cbegin();
    const auto endIter = itm->values.at(index.column()).cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); })
        && !itm->d->display.at(index.column()).isValid()) {
        return true; //it's already cleared
    }
    itm->d->display[index.column()] = QVariant();
    itm->values[index.column()].clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}